

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.hpp
# Opt level: O3

void __thiscall Centaurus::Context<char>::Context(Context<char> *this,char *filename)

{
  undefined1 auVar1 [16];
  value_type local_38;
  
  (this->m_grammar).super_IGrammar._vptr_IGrammar = (_func_int **)&PTR__Grammar_001a5db0;
  (this->m_grammar).m_networks._M_h._M_buckets = &(this->m_grammar).m_networks._M_h._M_single_bucket
  ;
  (this->m_grammar).m_networks._M_h._M_bucket_count = 1;
  (this->m_grammar).m_networks._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_grammar).m_networks._M_h._M_element_count = 0;
  (this->m_grammar).m_networks._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_grammar).m_identifiers.
  super__Vector_base<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [32])&(this->m_grammar).m_networks._M_h._M_rehash_policy._M_next_resize =
       ZEXT432(0) << 0x40;
  (this->m_grammar).m_root_id._vptr_Identifier = (_func_int **)&PTR__Identifier_001a5d30;
  (this->m_grammar).m_root_id.m_id._M_dataplus._M_p =
       (pointer)&(this->m_grammar).m_root_id.m_id.field_2;
  auVar1 = ZEXT816(0) << 0x20;
  (this->m_grammar).m_root_id.m_id._M_string_length = 0;
  (this->m_grammar).m_root_id.m_id.field_2._M_local_buf[0] = L'\0';
  (this->m_grammar).m_grammar_name._vptr_Identifier = (_func_int **)&PTR__Identifier_001a5d30;
  (this->m_grammar).m_grammar_name.m_id._M_dataplus._M_p =
       (pointer)&(this->m_grammar).m_grammar_name.m_id.field_2;
  (this->m_grammar).m_grammar_name.m_id._M_string_length = 0;
  (this->m_grammar).m_grammar_name.m_id.field_2._M_local_buf[0] = L'\0';
  (this->m_grammar).m_options.
  super_unordered_map<Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  ._M_h._M_buckets =
       &(this->m_grammar).m_options.
        super_unordered_map<Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
        ._M_h._M_single_bucket;
  (this->m_grammar).m_options.
  super_unordered_map<Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  ._M_h._M_bucket_count = 1;
  (this->m_grammar).m_options.
  super_unordered_map<Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  ._M_h._M_before_begin = (__node_base)auVar1._0_8_;
  (this->m_grammar).m_options.
  super_unordered_map<Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  ._M_h._M_element_count = auVar1._8_8_;
  (this->m_grammar).m_options.
  super_unordered_map<Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])
   &(this->m_grammar).m_options.
    super_unordered_map<Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
    ._M_h._M_rehash_policy._M_next_resize = auVar1;
  (this->m_grammar).m_options._vptr_GrammarOptions = (_func_int **)&PTR__GrammarOptions_001a62b8;
  (this->m_parser).super_IParser._vptr_IParser = (_func_int **)&PTR__ParserEM64T_001a5d60;
  asmjit::JitRuntime::JitRuntime(&(this->m_parser).m_runtime);
  asmjit::CodeHolder::CodeHolder(&(this->m_parser).m_code);
  (this->m_callbacks).
  super__Vector_base<void_*(*)(const_Centaurus::SymbolContext<char>_&),_std::allocator<void_*(*)(const_Centaurus::SymbolContext<char>_&)>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_callbacks).
  super__Vector_base<void_*(*)(const_Centaurus::SymbolContext<char>_&),_std::allocator<void_*(*)(const_Centaurus::SymbolContext<char>_&)>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_callbacks).
  super__Vector_base<void_*(*)(const_Centaurus::SymbolContext<char>_&),_std::allocator<void_*(*)(const_Centaurus::SymbolContext<char>_&)>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Grammar<char>::parse(&this->m_grammar,filename,1);
  ParserEM64T<char>::init(&this->m_parser,(EVP_PKEY_CTX *)this);
  local_38 = (value_type)0x0;
  std::
  vector<void_*(*)(const_Centaurus::SymbolContext<char>_&),_std::allocator<void_*(*)(const_Centaurus::SymbolContext<char>_&)>_>
  ::resize(&this->m_callbacks,(long)((int)(this->m_grammar).m_networks._M_h._M_element_count + 1),
           &local_38);
  return;
}

Assistant:

Context(const char *filename)
    {
        /*std::wifstream grammar_file(filename, std::ios::in);

        std::wstring wide_grammar(std::istreambuf_iterator<wchar_t>(grammar_file), {});

        Stream stream(std::move(wide_grammar));*/

        m_grammar.parse(filename);

        m_parser.init(m_grammar);

        m_callbacks.resize(m_grammar.get_machine_num() + 1, nullptr);
    }